

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_base64_decode(char *text,ptls_base64_decode_state_t *state,ptls_buffer_t *buf)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *in_RSI;
  long in_RDI;
  int j;
  char vc;
  int c;
  size_t text_index;
  uint8_t decoded [3];
  int ret;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  long local_28;
  undefined1 local_1f [3];
  int local_1c;
  int *local_10;
  long local_8;
  
  local_1c = 0;
  for (local_28 = 0;
      (local_10 = in_RSI, local_8 = in_RDI, *(char *)(in_RDI + local_28) != '\0' &&
      ((((cVar1 = *(char *)(in_RDI + local_28), cVar1 == ' ' || (cVar1 == '\t')) || (cVar1 == '\r'))
       || (cVar1 == '\n')))); local_28 = local_28 + 1) {
  }
  do {
    uVar2 = in_stack_ffffffffffffffc8 & 0xffffff;
    if ((*(char *)(local_8 + local_28) != '\0') &&
       (uVar2 = in_stack_ffffffffffffffc8 & 0xffffff, local_1c == 0)) {
      uVar2 = CONCAT13(local_10[2] == 1,(int3)in_stack_ffffffffffffffc8);
    }
    in_stack_ffffffffffffffc8 = uVar2;
    if ((char)(in_stack_ffffffffffffffc8 >> 0x18) == '\0') {
      return local_1c;
    }
    lVar5 = local_28 + 1;
    iVar3 = (int)*(char *)(local_8 + local_28);
    if ((iVar3 < 1) || (0x7e < iVar3)) {
      iVar4 = -1;
    }
    else {
      iVar4 = (int)ptls_base64_values[iVar3];
    }
    if ((char)iVar4 == -1) {
      if (((*local_10 == 2) && (iVar3 == 0x3d)) && (*(char *)(local_8 + lVar5) == '=')) {
        *local_10 = 4;
        local_10[1] = 1;
        local_10[3] = local_10[3] << 0xc;
        local_28 = local_28 + 2;
      }
      else if ((*local_10 == 3) && (iVar3 == 0x3d)) {
        *local_10 = 4;
        local_10[1] = 2;
        local_10[3] = local_10[3] << 6;
        local_28 = lVar5;
      }
      else {
        for (; (*(char *)(local_8 + local_28) != '\0' &&
               (((cVar1 = *(char *)(local_8 + local_28), cVar1 == ' ' || (cVar1 == '\t')) ||
                ((cVar1 == '\r' || (((cVar1 == '\n' || (cVar1 == '\v')) || (cVar1 == '\f'))))))));
            local_28 = local_28 + 1) {
        }
        if (*(char *)(local_8 + local_28) == '\0') {
          return local_1c;
        }
        local_10[1] = 0;
        local_10[2] = -1;
        local_1c = 0x232;
      }
    }
    else {
      *local_10 = *local_10 + 1;
      local_10[3] = local_10[3] << 6;
      local_10[3] = (int)(char)iVar4 | local_10[3];
      local_28 = lVar5;
    }
    if ((local_1c == 0) && (*local_10 == 4)) {
      for (iVar3 = 0; iVar3 < local_10[1]; iVar3 = iVar3 + 1) {
        local_1f[iVar3] = (char)((uint)local_10[3] >> (('\x02' - (char)iVar3) * '\b' & 0x1fU));
      }
      local_1c = ptls_buffer__do_pushv
                           ((ptls_buffer_t *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
                            (void *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
      if (local_1c == 0) {
        if (local_10[1] < 3) {
          for (; *(char *)(local_8 + local_28) != '\0'; local_28 = local_28 + 1) {
          }
          if (*(char *)(local_8 + local_28) == '\0') {
            local_10[2] = 0;
            local_1c = 0;
          }
          else {
            local_10[2] = -1;
            local_1c = 0x232;
          }
          return local_1c;
        }
        local_10[3] = 0;
        local_10[1] = 3;
        *local_10 = 0;
      }
    }
  } while( true );
}

Assistant:

int ptls_base64_decode(const char *text, ptls_base64_decode_state_t *state, ptls_buffer_t *buf)
{
    int ret = 0;
    uint8_t decoded[3];
    size_t text_index = 0;
    int c;
    signed char vc;

    /* skip initial blanks */
    while (text[text_index] != 0) {
        c = text[text_index];

        if (c == ' ' || c == '\t' || c == '\r' || c == '\n') {
            text_index++;
        } else {
            break;
        }
    }

    while (text[text_index] != 0 && ret == 0 && state->status == PTLS_BASE64_DECODE_IN_PROGRESS) {
        c = text[text_index++];

        vc = 0 < c && c < 0x7f ? ptls_base64_values[c] : -1;
        if (vc == -1) {
            if (state->nbc == 2 && c == '=' && text[text_index] == '=') {
                state->nbc = 4;
                text_index++;
                state->nbo = 1;
                state->v <<= 12;
            } else if (state->nbc == 3 && c == '=') {
                state->nbc = 4;
                state->nbo = 2;
                state->v <<= 6;
            } else {
                /* Skip final blanks */
                for (--text_index; text[text_index] != 0; ++text_index) {
                    c = text[text_index];
                    if (!(c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C))
                        break;
                }

                /* Should now be at end of buffer */
                if (text[text_index] == 0) {
                    break;
                } else {
                    /* Not at end of buffer, signal a decoding error */
                    state->nbo = 0;
                    state->status = PTLS_BASE64_DECODE_FAILED;
                    ret = PTLS_ERROR_INCORRECT_BASE64;
                }
            }
        } else {
            state->nbc++;
            state->v <<= 6;
            state->v |= vc;
        }

        if (ret == 0 && state->nbc == 4) {
            /* Convert to up to 3 octets */
            for (int j = 0; j < state->nbo; j++) {
                decoded[j] = (uint8_t)(state->v >> (8 * (2 - j)));
            }

            ret = ptls_buffer__do_pushv(buf, decoded, state->nbo);

            if (ret == 0) {
                /* test for fin or continuation */
                if (state->nbo < 3) {
                    /* Check that there are only trainling blanks on this line */
                    while (text[text_index] != 0) {
                        c = text[text_index++];

                        if (c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C) {
                            continue;
                        }
                    }
                    if (text[text_index] == 0) {
                        state->status = PTLS_BASE64_DECODE_DONE;
                    } else {
                        state->status = PTLS_BASE64_DECODE_FAILED;
                        ret = PTLS_ERROR_INCORRECT_BASE64;
                    }
                    break;
                } else {
                    state->v = 0;
                    state->nbo = 3;
                    state->nbc = 0;
                }
            }
        }
    }
    return ret;
}